

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

avector<Vec3fa> * __thiscall
embree::XMLLoader::loadVec3faArray(XMLLoader *this,Ref<embree::XML> *xml)

{
  Vec3fa *pVVar1;
  undefined8 uVar2;
  size_type sVar3;
  ulong uVar4;
  bool bVar5;
  Vec3fa *pVVar6;
  reference pvVar7;
  size_type sVar8;
  runtime_error *this_00;
  ulong uVar9;
  unsigned_long *puVar10;
  long *in_RDX;
  avector<Vec3fa> *in_RDI;
  float fVar11;
  float fVar12;
  size_t i_11;
  size_t i_4;
  vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_> temp;
  avector<Vec3fa> *data;
  size_t i_13;
  size_t i_12;
  size_t i_5;
  size_t i_6;
  size_t i_3;
  size_t i_2;
  Vec3fa *old_items;
  size_t i_1;
  size_t i;
  size_t i_10;
  size_t i_9;
  Vec3fa *old_items_1;
  size_t i_8;
  size_t i_7;
  size_t new_size_alloced;
  size_t new_size_alloced_1;
  char *in_stack_fffffffffffffa68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa78;
  vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_> *in_stack_fffffffffffffa80;
  string *in_stack_fffffffffffffab0;
  XML *in_stack_fffffffffffffab8;
  undefined1 cast;
  Token *in_stack_fffffffffffffac8;
  ParseLocation *in_stack_fffffffffffffb18;
  ulong local_460;
  string local_430 [39];
  undefined1 local_409;
  undefined8 local_408;
  ulong uStack_400;
  ulong local_3f8;
  undefined1 local_3e9;
  vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_> local_3e8;
  allocator local_3b9;
  string local_3b8 [32];
  string local_398 [32];
  long *local_378;
  long *local_360;
  long *local_358;
  long *local_350;
  long *local_348;
  long *local_340;
  long *local_338;
  float local_324;
  float local_320;
  float local_31c;
  Ref<embree::XML> *in_stack_fffffffffffffce8;
  XMLLoader *in_stack_fffffffffffffcf0;
  ulong local_170;
  ulong local_168;
  ulong local_158;
  ulong local_150;
  ulong local_e8;
  ulong local_e0;
  ulong local_d0;
  ulong local_c8;
  unsigned_long local_60 [2];
  ulong local_50;
  ulong local_48;
  size_type local_38;
  unsigned_long local_30 [2];
  ulong local_20;
  ulong local_18;
  ulong local_8;
  
  if (*in_RDX == 0) {
    in_RDI->size_active = 0;
    in_RDI->size_alloced = 0;
    in_RDI->items = (Vec3fa *)0x0;
  }
  else {
    local_378 = in_RDX;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3b8,"ofs",&local_3b9);
    XML::parm(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    bVar5 = std::operator!=(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
    std::__cxx11::string::~string(local_398);
    std::__cxx11::string::~string(local_3b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
    if (bVar5) {
      loadBinary<std::vector<embree::Vec3<float>,std::allocator<embree::Vec3<float>>>>
                (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      local_3e9 = 0;
      in_RDI->size_active = 0;
      in_RDI->size_alloced = 0;
      in_RDI->items = (Vec3fa *)0x0;
      sVar8 = std::vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>::size
                        (&local_3e8);
      local_48 = sVar8;
      if (in_RDI->size_alloced < sVar8) {
        local_38 = sVar8;
        if (in_RDI->size_alloced != 0) {
          local_50 = in_RDI->size_alloced;
          while (local_50 < local_48) {
            local_60[1] = 1;
            local_60[0] = local_50 << 1;
            puVar10 = std::max<unsigned_long>(local_60 + 1,local_60);
            local_50 = *puVar10;
          }
          local_38 = local_50;
        }
      }
      else {
        local_38 = in_RDI->size_alloced;
      }
      sVar3 = local_38;
      local_150 = sVar8;
      if (sVar8 < in_RDI->size_active) {
        for (; local_150 < in_RDI->size_active; local_150 = local_150 + 1) {
        }
        in_RDI->size_active = sVar8;
      }
      if (local_38 == in_RDI->size_alloced) {
        for (local_158 = in_RDI->size_active; local_158 < sVar8; local_158 = local_158 + 1) {
        }
        in_RDI->size_active = sVar8;
      }
      else {
        pVVar1 = in_RDI->items;
        pVVar6 = (Vec3fa *)
                 alignedMalloc((size_t)in_stack_fffffffffffffa78,(size_t)in_stack_fffffffffffffa70);
        in_RDI->items = pVVar6;
        for (local_168 = 0; local_168 < in_RDI->size_active; local_168 = local_168 + 1) {
          pVVar6 = in_RDI->items;
          uVar2 = *(undefined8 *)((long)&pVVar1[local_168].field_0 + 8);
          *(undefined8 *)&pVVar6[local_168].field_0 = *(undefined8 *)&pVVar1[local_168].field_0;
          *(undefined8 *)((long)&pVVar6[local_168].field_0 + 8) = uVar2;
        }
        for (local_170 = in_RDI->size_active; local_170 < sVar8; local_170 = local_170 + 1) {
        }
        alignedFree(in_stack_fffffffffffffa68);
        in_RDI->size_active = sVar8;
        in_RDI->size_alloced = sVar3;
      }
      for (local_3f8 = 0; uVar9 = local_3f8,
          sVar8 = std::vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>::size
                            (&local_3e8), uVar9 < sVar8; local_3f8 = local_3f8 + 1) {
        pvVar7 = std::vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>::operator[]
                           (&local_3e8,local_3f8);
        local_408 = *(undefined8 *)&pvVar7->field_0;
        uStack_400 = (ulong)(uint)(pvVar7->field_0).field_0.z;
        pVVar1 = in_RDI->items;
        *(undefined8 *)&pVVar1[local_3f8].field_0 = local_408;
        *(ulong *)((long)&pVVar1[local_3f8].field_0 + 8) = uStack_400;
      }
      local_3e9 = 1;
      std::vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>::~vector
                (in_stack_fffffffffffffa80);
    }
    else {
      local_409 = 0;
      in_RDI->size_active = 0;
      in_RDI->size_alloced = 0;
      in_RDI->items = (Vec3fa *)0x0;
      local_338 = local_378;
      sVar8 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                        ((vector<embree::Token,_std::allocator<embree::Token>_> *)
                         (*local_378 + 0x98));
      if (sVar8 % 3 != 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_340 = local_378;
        ParseLocation::str_abi_cxx11_(in_stack_fffffffffffffb18);
        std::operator+(in_stack_fffffffffffffa78,(char *)in_stack_fffffffffffffa70);
        std::runtime_error::runtime_error(this_00,local_430);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_348 = local_378;
      sVar8 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                        ((vector<embree::Token,_std::allocator<embree::Token>_> *)
                         (*local_378 + 0x98));
      uVar9 = sVar8 / 3;
      local_18 = uVar9;
      if (in_RDI->size_alloced < uVar9) {
        local_8 = uVar9;
        if (in_RDI->size_alloced != 0) {
          local_20 = in_RDI->size_alloced;
          while (local_20 < local_18) {
            local_30[1] = 1;
            local_30[0] = local_20 << 1;
            puVar10 = std::max<unsigned_long>(local_30 + 1,local_30);
            local_20 = *puVar10;
          }
          local_8 = local_20;
        }
      }
      else {
        local_8 = in_RDI->size_alloced;
      }
      uVar4 = local_8;
      local_c8 = uVar9;
      if (uVar9 < in_RDI->size_active) {
        for (; local_c8 < in_RDI->size_active; local_c8 = local_c8 + 1) {
        }
        in_RDI->size_active = uVar9;
      }
      if (local_8 == in_RDI->size_alloced) {
        for (local_d0 = in_RDI->size_active; local_d0 < uVar9; local_d0 = local_d0 + 1) {
        }
        in_RDI->size_active = uVar9;
      }
      else {
        pVVar1 = in_RDI->items;
        in_stack_fffffffffffffac8 =
             (Token *)alignedMalloc((size_t)in_stack_fffffffffffffa78,
                                    (size_t)in_stack_fffffffffffffa70);
        in_RDI->items = (Vec3fa *)in_stack_fffffffffffffac8;
        for (local_e0 = 0; local_e0 < in_RDI->size_active; local_e0 = local_e0 + 1) {
          pVVar6 = in_RDI->items;
          uVar2 = *(undefined8 *)((long)&pVVar1[local_e0].field_0 + 8);
          *(undefined8 *)&pVVar6[local_e0].field_0 = *(undefined8 *)&pVVar1[local_e0].field_0;
          *(undefined8 *)((long)&pVVar6[local_e0].field_0 + 8) = uVar2;
        }
        for (local_e8 = in_RDI->size_active; local_e8 < uVar9; local_e8 = local_e8 + 1) {
        }
        alignedFree(in_stack_fffffffffffffa68);
        in_RDI->size_active = uVar9;
        in_RDI->size_alloced = uVar4;
      }
      for (local_460 = 0; uVar9 = in_RDI->size_active, local_460 < uVar9; local_460 = local_460 + 1)
      {
        local_350 = local_378;
        std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
                  ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_378 + 0x98),
                   local_460 * 3);
        cast = (undefined1)(uVar9 >> 0x38);
        fVar11 = Token::Float(in_stack_fffffffffffffac8,(bool)cast);
        local_358 = local_378;
        std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
                  ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_378 + 0x98),
                   local_460 * 3 + 1);
        fVar12 = Token::Float(in_stack_fffffffffffffac8,(bool)cast);
        local_360 = local_378;
        std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
                  ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_378 + 0x98),
                   local_460 * 3 + 2);
        local_324 = Token::Float(in_stack_fffffffffffffac8,(bool)cast);
        pVVar1 = in_RDI->items;
        *(ulong *)&pVVar1[local_460].field_0 = CONCAT44(fVar12,fVar11);
        *(ulong *)((long)&pVVar1[local_460].field_0 + 8) = (ulong)(uint)local_324;
        local_320 = fVar12;
        local_31c = fVar11;
      }
    }
  }
  return in_RDI;
}

Assistant:

avector<Vec3fa> XMLLoader::loadVec3faArray(const Ref<XML>& xml)
  {
    if (!xml) return avector<Vec3fa>();

    if (xml->parm("ofs") != "") {
      std::vector<Vec3f> temp = loadBinary<std::vector<Vec3f>>(xml);
      avector<Vec3fa> data; data.resize(temp.size());
      for (size_t i=0; i<temp.size(); i++) data[i] = Vec3fa(temp[i]);
      return data;
    } 
    else 
    {
      avector<Vec3fa> data;
      if (xml->body.size() % 3 != 0) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong vector<float3> body");
      data.resize(xml->body.size()/3);
      for (size_t i=0; i<data.size(); i++) 
        data[i] = Vec3fa(xml->body[3*i+0].Float(),xml->body[3*i+1].Float(),xml->body[3*i+2].Float());
      return data;
    }
  }